

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::File::close(File *this,int __fd)

{
  int in_EAX;
  SystemError *this_00;
  int *piVar1;
  
  if (this->fd_ != -1) {
    in_EAX = ::close(this->fd_);
    this->fd_ = -1;
    if (in_EAX != 0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x18);
      piVar1 = __errno_location();
      SystemError::SystemError(this_00,*piVar1,(CStringRef)0x145f99);
      __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
    }
  }
  return in_EAX;
}

Assistant:

void fmt::File::close() {
  if (fd_ == -1)
    return;
  // Don't retry close in case of EINTR!
  // See http://linux.derkeiler.com/Mailing-Lists/Kernel/2005-09/3000.html
  int result = FMT_POSIX_CALL(close(fd_));
  fd_ = -1;
  if (result != 0)
    FMT_THROW(SystemError(errno, "cannot close file"));
}